

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall Saturation::SaturationAlgorithm::~SaturationAlgorithm(SaturationAlgorithm *this)

{
  Splitter *this_00;
  ConsequenceFinder *this_01;
  SymElOutput *this_02;
  SimplifyingGeneratingInference *pSVar1;
  ImmediateSimplificationEngine *pIVar2;
  LiteralSelector *pLVar3;
  ForwardSimplificationEngine *pFVar4;
  SimplificationEngine *pSVar5;
  BackwardSimplificationEngine *pBVar6;
  
  (this->super_MainLoop)._vptr_MainLoop = (_func_int **)&PTR__SaturationAlgorithm_00a01800;
  s_instance = (SaturationAlgorithm *)0x0;
  this_00 = this->_splitter;
  if (this_00 != (Splitter *)0x0) {
    Splitter::~Splitter(this_00);
    ::operator_delete(this_00,0x1a8);
  }
  this_01 = this->_consFinder;
  if (this_01 != (ConsequenceFinder *)0x0) {
    ConsequenceFinder::~ConsequenceFinder(this_01);
    ::operator_delete(this_01,0xa0);
  }
  this_02 = this->_symEl;
  if (this_02 != (SymElOutput *)0x0) {
    SymElOutput::~SymElOutput(this_02);
    ::operator_delete(this_02,0x70);
  }
  (this->_active->super_RandomAccessClauseContainer)._salg = (SaturationAlgorithm *)0x0;
  (((this->_passive)._M_t.
    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
    ._M_t.
    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
    .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl)->
  super_RandomAccessClauseContainer)._salg = (SaturationAlgorithm *)0x0;
  pSVar1 = (this->_generator)._obj;
  if (pSVar1 != (SimplifyingGeneratingInference *)0x0) {
    (*(pSVar1->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  pIVar2 = (this->_immediateSimplifier)._obj;
  if (pIVar2 != (ImmediateSimplificationEngine *)0x0) {
    (*(pIVar2->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  while (this->_fwSimplifiers != (FwSimplList *)0x0) {
    pFVar4 = Lib::List<Inferences::ForwardSimplificationEngine_*>::pop(&this->_fwSimplifiers);
    (*(pFVar4->super_InferenceEngine)._vptr_InferenceEngine[3])(pFVar4);
    (*(pFVar4->super_InferenceEngine)._vptr_InferenceEngine[1])(pFVar4);
  }
  while (this->_simplifiers != (SimplList *)0x0) {
    pSVar5 = Lib::List<Inferences::SimplificationEngine_*>::pop(&this->_simplifiers);
    (*(pSVar5->super_InferenceEngine)._vptr_InferenceEngine[3])(pSVar5);
    (*(pSVar5->super_InferenceEngine)._vptr_InferenceEngine[1])(pSVar5);
  }
  while (this->_bwSimplifiers != (BwSimplList *)0x0) {
    pBVar6 = Lib::List<Inferences::BackwardSimplificationEngine_*>::pop(&this->_bwSimplifiers);
    (*(pBVar6->super_InferenceEngine)._vptr_InferenceEngine[3])(pBVar6);
    (*(pBVar6->super_InferenceEngine)._vptr_InferenceEngine[1])(pBVar6);
  }
  if (this->_unprocessed != (UnprocessedClauseContainer *)0x0) {
    (*(this->_unprocessed->super_ClauseContainer)._vptr_ClauseContainer[1])();
  }
  if (this->_active != (ActiveClauseContainer *)0x0) {
    (*(this->_active->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
      [1])();
  }
  pLVar3 = (this->_sosLiteralSelector)._obj;
  if (pLVar3 != (LiteralSelector *)0x0) {
    (*pLVar3->_vptr_LiteralSelector[1])();
  }
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(&this->_activeContRemovalSData);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(&this->_passiveContRemovalSData);
  std::
  unique_ptr<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
  ::~unique_ptr(&this->_partialRedundancyHandler);
  pLVar3 = (this->_selector)._obj;
  if (pLVar3 != (LiteralSelector *)0x0) {
    (*pLVar3->_vptr_LiteralSelector[1])();
  }
  Lib::SmartPtr<Kernel::Ordering>::~SmartPtr(&this->_ordering);
  pIVar2 = (this->_immediateSimplifier)._obj;
  if (pIVar2 != (ImmediateSimplificationEngine *)0x0) {
    (*(pIVar2->super_InferenceEngine)._vptr_InferenceEngine[1])();
  }
  pSVar1 = (this->_generator)._obj;
  if (pSVar1 != (SimplifyingGeneratingInference *)0x0) {
    (*(pSVar1->super_InferenceEngine)._vptr_InferenceEngine[1])();
  }
  std::
  unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  ::~unique_ptr(&this->_passive);
  Lib::Stack<Kernel::Clause_*>::~Stack(&this->_postponedClauseRemovals);
  Lib::Stack<Kernel::Clause_*>::~Stack(&(this->_newClauses)._s);
  Lib::SmartPtr<Indexing::IndexManager>::~SmartPtr(&this->_imgr);
  return;
}

Assistant:

SaturationAlgorithm::~SaturationAlgorithm()
{
  ASS_EQ(s_instance,this);

  s_instance = 0;

  if (_splitter) {
    delete _splitter;
  }
  if (_consFinder) {
    delete _consFinder;
  }
  if (_symEl) {
    delete _symEl;
  }

  _active->detach();
  _passive->detach();

  if (_generator) {
    _generator->detach();
  }
  if (_immediateSimplifier) {
    _immediateSimplifier->detach();
  }

  while (_fwSimplifiers) {
    ForwardSimplificationEngine* fse = FwSimplList::pop(_fwSimplifiers);
    fse->detach();
    delete fse;
  }
  while (_simplifiers) {
    SimplificationEngine* fse = SimplList::pop(_simplifiers);
    fse->detach();
    delete fse;
  }
  while (_bwSimplifiers) {
    BackwardSimplificationEngine* bse = BwSimplList::pop(_bwSimplifiers);
    bse->detach();
    delete bse;
  }

  delete _unprocessed;
  delete _active;
}